

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCompOpEvalFirst(xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *first)

{
  int *piVar1;
  xmlXPathCompExprPtr pxVar2;
  int iVar3;
  xmlXPathOp xVar4;
  int iVar5;
  xmlXPathObjectPtr obj;
  xmlNodeSetPtr pxVar6;
  xmlXPathObjectPtr pxVar7;
  
  if (ctxt->error != 0) {
    return 0;
  }
  if ((ctxt->context->opLimit != 0) && (iVar3 = xmlXPathCheckOpLimit(ctxt,1), iVar3 < 0)) {
    return 0;
  }
  iVar3 = ctxt->context->depth;
  if (4999 < iVar3) {
    iVar3 = 0x1a;
LAB_001c8f24:
    xmlXPathErr(ctxt,iVar3);
    return 0;
  }
  ctxt->context->depth = iVar3 + 1;
  xVar4 = op->op;
  if (XPATH_OP_SORT < xVar4) {
switchD_001c8f53_caseD_1:
    xVar4 = xmlXPathCompOpEval(ctxt,op);
    goto switchD_001c8f53_caseD_0;
  }
  pxVar2 = ctxt->comp;
  switch(xVar4) {
  case XPATH_OP_END:
    break;
  default:
    goto switchD_001c8f53_caseD_1;
  case XPATH_OP_UNION:
    xVar4 = xmlXPathCompOpEvalFirst(ctxt,pxVar2->steps + op->ch1,first);
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar7 = ctxt->value;
    if (((pxVar7 != (xmlXPathObjectPtr)0x0) && (pxVar7->type == XPATH_NODESET)) &&
       (pxVar6 = pxVar7->nodesetval, pxVar6 != (xmlNodeSetPtr)0x0)) {
      iVar3 = pxVar6->nodeNr;
      if (0 < (long)iVar3) {
        if (iVar3 != 1) {
          libxml_domnode_tim_sort(pxVar6->nodeTab,(long)iVar3);
        }
        *first = *ctxt->value->nodesetval->nodeTab;
      }
    }
    iVar3 = xmlXPathCompOpEvalFirst(ctxt,pxVar2->steps + op->ch2,first);
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar7 = xmlXPathValuePop(ctxt);
    obj = xmlXPathValuePop(ctxt);
    if (((obj == (xmlXPathObjectPtr)0x0) ||
        (pxVar7 == (xmlXPathObjectPtr)0x0 || obj->type != XPATH_NODESET)) ||
       (pxVar7->type != XPATH_NODESET)) {
      xmlXPathReleaseObject(ctxt->context,obj);
      xmlXPathReleaseObject(ctxt->context,pxVar7);
      iVar3 = 0xb;
      goto LAB_001c8f24;
    }
    if ((ctxt->context->opLimit == 0) ||
       (((obj->nodesetval == (xmlNodeSetPtr)0x0 ||
         (iVar5 = xmlXPathCheckOpLimit(ctxt,(long)obj->nodesetval->nodeNr), -1 < iVar5)) &&
        ((pxVar7->nodesetval == (xmlNodeSetPtr)0x0 ||
         (iVar5 = xmlXPathCheckOpLimit(ctxt,(long)pxVar7->nodesetval->nodeNr), -1 < iVar5)))))) {
      pxVar6 = pxVar7->nodesetval;
      if ((pxVar6 != (xmlNodeSetPtr)0x0) && (pxVar6->nodeNr != 0)) {
        pxVar6 = xmlXPathNodeSetMerge(obj->nodesetval,pxVar6);
        obj->nodesetval = pxVar6;
        if (pxVar6 == (xmlNodeSetPtr)0x0) {
          xmlXPathPErrMemory(ctxt);
        }
      }
      xmlXPathValuePush(ctxt,obj);
      xmlXPathReleaseObject(ctxt->context,pxVar7);
      xVar4 = iVar3 + xVar4;
    }
    else {
      xmlXPathReleaseObject(ctxt->context,obj);
      xmlXPathReleaseObject(ctxt->context,pxVar7);
    }
    break;
  case XPATH_OP_ROOT:
    xmlXPathRoot(ctxt);
    goto LAB_001c922c;
  case XPATH_OP_NODE:
    xVar4 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar4 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    if ((long)op->ch2 != -1) {
      iVar3 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch2);
      xVar4 = iVar3 + xVar4;
    }
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar7 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
    xmlXPathValuePush(ctxt,pxVar7);
    break;
  case XPATH_OP_COLLECT:
    if ((long)op->ch1 != -1) {
      iVar3 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
      if (ctxt->error != 0) {
        return 0;
      }
      iVar5 = xmlXPathNodeCollectAndTest(ctxt,op,first,(xmlNodePtr *)0x0,0);
      xVar4 = iVar5 + iVar3;
      break;
    }
    goto LAB_001c922c;
  case XPATH_OP_VALUE:
    pxVar7 = xmlXPathCacheObjectCopy(ctxt,(xmlXPathObjectPtr)op->value4);
    xmlXPathValuePush(ctxt,pxVar7);
LAB_001c922c:
    xVar4 = XPATH_OP_END;
    break;
  case XPATH_OP_FILTER:
    xVar4 = xmlXPathCompOpEvalFilterFirst(ctxt,op,first);
    break;
  case XPATH_OP_SORT:
    xVar4 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar4 = xmlXPathCompOpEvalFirst(ctxt,pxVar2->steps + op->ch1,first);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar7 = ctxt->value;
    if ((((pxVar7 != (xmlXPathObjectPtr)0x0) && (pxVar7->type == XPATH_NODESET)) &&
        (pxVar6 = pxVar7->nodesetval, pxVar6 != (xmlNodeSetPtr)0x0)) && (1 < (long)pxVar6->nodeNr))
    {
      libxml_domnode_tim_sort(pxVar6->nodeTab,(long)pxVar6->nodeNr);
    }
  }
switchD_001c8f53_caseD_0:
  piVar1 = &ctxt->context->depth;
  *piVar1 = *piVar1 + -1;
  return xVar4;
}

Assistant:

static int
xmlXPathCompOpEvalFirst(xmlXPathParserContextPtr ctxt,
                        xmlXPathStepOpPtr op, xmlNodePtr * first)
{
    int total = 0, cur;
    xmlXPathCompExprPtr comp;
    xmlXPathObjectPtr arg1, arg2;

    CHECK_ERROR0;
    if (OP_LIMIT_EXCEEDED(ctxt, 1))
        return(0);
    if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
        XP_ERROR0(XPATH_RECURSION_LIMIT_EXCEEDED);
    ctxt->context->depth += 1;
    comp = ctxt->comp;
    switch (op->op) {
        case XPATH_OP_END:
            break;
        case XPATH_OP_UNION:
            total =
                xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch1],
                                        first);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL)
                && (ctxt->value->type == XPATH_NODESET)
                && (ctxt->value->nodesetval != NULL)
                && (ctxt->value->nodesetval->nodeNr >= 1)) {
                /*
                 * limit tree traversing to first node in the result
                 */
		/*
		* OPTIMIZE TODO: This implicitly sorts
		*  the result, even if not needed. E.g. if the argument
		*  of the count() function, no sorting is needed.
		* OPTIMIZE TODO: How do we know if the node-list wasn't
		*  already sorted?
		*/
		if (ctxt->value->nodesetval->nodeNr > 1)
		    xmlXPathNodeSetSort(ctxt->value->nodesetval);
                *first = ctxt->value->nodesetval->nodeTab[0];
            }
            cur =
                xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch2],
                                        first);
	    CHECK_ERROR0;

            arg2 = xmlXPathValuePop(ctxt);
            arg1 = xmlXPathValuePop(ctxt);
            if ((arg1 == NULL) || (arg1->type != XPATH_NODESET) ||
                (arg2 == NULL) || (arg2->type != XPATH_NODESET)) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                XP_ERROR0(XPATH_INVALID_TYPE);
            }
            if ((ctxt->context->opLimit != 0) &&
                (((arg1->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg1->nodesetval->nodeNr) < 0)) ||
                 ((arg2->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg2->nodesetval->nodeNr) < 0)))) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                break;
            }

            if ((arg2->nodesetval != NULL) &&
                (arg2->nodesetval->nodeNr != 0)) {
                arg1->nodesetval = xmlXPathNodeSetMerge(arg1->nodesetval,
                                                        arg2->nodesetval);
                if (arg1->nodesetval == NULL)
                    xmlXPathPErrMemory(ctxt);
            }
            xmlXPathValuePush(ctxt, arg1);
	    xmlXPathReleaseObject(ctxt->context, arg2);
            total += cur;
            break;
        case XPATH_OP_ROOT:
            xmlXPathRoot(ctxt);
            break;
        case XPATH_OP_NODE:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt,
		ctxt->context->node));
            break;
        case XPATH_OP_COLLECT:{
                if (op->ch1 == -1)
                    break;

                total = xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;

                total += xmlXPathNodeCollectAndTest(ctxt, op, first, NULL, 0);
                break;
            }
        case XPATH_OP_VALUE:
            xmlXPathValuePush(ctxt, xmlXPathCacheObjectCopy(ctxt, op->value4));
            break;
        case XPATH_OP_SORT:
            if (op->ch1 != -1)
                total +=
                    xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch1],
                                            first);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL)
                && (ctxt->value->type == XPATH_NODESET)
                && (ctxt->value->nodesetval != NULL)
		&& (ctxt->value->nodesetval->nodeNr > 1))
                xmlXPathNodeSetSort(ctxt->value->nodesetval);
            break;
#ifdef XP_OPTIMIZED_FILTER_FIRST
	case XPATH_OP_FILTER:
                total += xmlXPathCompOpEvalFilterFirst(ctxt, op, first);
            break;
#endif
        default:
            total += xmlXPathCompOpEval(ctxt, op);
            break;
    }

    ctxt->context->depth -= 1;
    return(total);
}